

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWaveBank_GetWaveProperties
                   (FACTWaveBank *pWaveBank,uint16_t nWaveIndex,FACTWaveProperties *pWaveProperties)

{
  uint uVar1;
  FACTWaveBankEntry *pFVar2;
  uint uVar3;
  uint uVar4;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    return 1;
  }
  FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
  pFVar2 = pWaveBank->entries;
  if (pWaveBank->waveBankNames == (char *)0x0) {
    SDL_memset(pWaveProperties,0,0x40);
  }
  else {
    SDL_memcpy(pWaveProperties,pWaveBank->waveBankNames + (ulong)nWaveIndex * 0x40,0x40);
  }
  pWaveProperties->format = pFVar2[nWaveIndex].Format;
  uVar3 = pFVar2[nWaveIndex].PlayRegion.dwLength;
  pWaveProperties->durationInSamples = uVar3;
  uVar1 = pFVar2[nWaveIndex].Format.dwValue;
  if ((uVar1 & 3) == 2) {
    uVar4 = uVar1 >> 0x17 & 0xff;
    uVar3 = (uVar4 * 2 + 0x20) * (uVar3 / ((uVar1 >> 2 & 7) * (uVar4 + 0x16)));
  }
  else {
    if ((uVar1 & 3) != 0) goto LAB_0010c010;
    uVar3 = uVar3 >> (byte)(uVar1 >> 0x1f);
    pWaveProperties->durationInSamples = uVar3;
    uVar3 = uVar3 / (pFVar2[nWaveIndex].Format.dwValue >> 2 & 7);
  }
  pWaveProperties->durationInSamples = uVar3;
LAB_0010c010:
  pWaveProperties->loopRegion = pFVar2[nWaveIndex].LoopRegion;
  pWaveProperties->streaming = (uint)pWaveBank->streaming;
  FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTWaveBank_GetWaveProperties(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	FACTWaveProperties *pWaveProperties
) {
	FACTWaveBankEntry *entry;
	if (pWaveBank == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	entry = &pWaveBank->entries[nWaveIndex];

	if (pWaveBank->waveBankNames)
	{
		FAudio_memcpy(
			pWaveProperties->friendlyName,
			&pWaveBank->waveBankNames[nWaveIndex * 64],
			sizeof(pWaveProperties->friendlyName)
		);
	}
	else
	{
		FAudio_zero(
			pWaveProperties->friendlyName,
			sizeof(pWaveProperties->friendlyName)
		);
	}

	pWaveProperties->format = entry->Format;
	pWaveProperties->durationInSamples = entry->PlayRegion.dwLength;
	if (entry->Format.wFormatTag == 0)
	{
		pWaveProperties->durationInSamples /= (8 << entry->Format.wBitsPerSample) / 8;
		pWaveProperties->durationInSamples /= entry->Format.nChannels;
	}
	else if (entry->Format.wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		pWaveProperties->durationInSamples = (
			pWaveProperties->durationInSamples /
			((entry->Format.wBlockAlign + 22) * entry->Format.nChannels) *
			((entry->Format.wBlockAlign + 16) * 2)
		);
	}
	else
	{
		FAudio_assert(0 && "Unrecognized wFormatTag!");
	}

	pWaveProperties->loopRegion = entry->LoopRegion;
	pWaveProperties->streaming = pWaveBank->streaming;

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}